

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

string * __thiscall CLI::App::_compare_subcommand_names_abi_cxx11_(App *this,App *subcom,App *base)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  ulong uVar5;
  string *psVar6;
  string *cmpres_1;
  string *cmpres;
  reference local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *les_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  reference local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *les;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_68;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<CLI::App> *subc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  App *base_local;
  App *subcom_local;
  App *this_local;
  
  if ((_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_ ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)
                                   ::estring_abi_cxx11_), iVar2 != 0)) {
    ::std::__cxx11::string::string
              ((string *)
               &_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::
                estring_abi_cxx11_);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::
                  estring_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::
                         estring_abi_cxx11_);
  }
  if ((subcom->disabled_ & 1U) == 0) {
    __end1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&base->subcommands_);
    subc = (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                     (&base->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                       *)&subc), bVar1) {
      local_48 = &__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                  ::operator*(&__end1)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
      peVar3 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(local_48);
      if ((peVar3 != subcom) &&
         (peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_48), (peVar4->disabled_ & 1U) == 0)) {
        get_name_abi_cxx11_(subcom);
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_48);
          psVar6 = get_name_abi_cxx11_(subcom);
          ::std::__cxx11::string::string((string *)&local_68,(string *)psVar6);
          bVar1 = check_name(peVar4,&local_68);
          ::std::__cxx11::string::~string((string *)&local_68);
          if (bVar1) {
            psVar6 = get_name_abi_cxx11_(subcom);
            return psVar6;
          }
        }
        peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        get_name_abi_cxx11_(peVar4);
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_48);
          psVar6 = get_name_abi_cxx11_(peVar4);
          ::std::__cxx11::string::string((string *)&__range3,(string *)psVar6);
          bVar1 = check_name(subcom,(string *)&__range3);
          ::std::__cxx11::string::~string((string *)&__range3);
          if (bVar1) {
            peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48);
            psVar6 = get_name_abi_cxx11_(peVar4);
            return psVar6;
          }
        }
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&subcom->aliases_);
        les = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&subcom->aliases_);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&les), bVar1) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end3);
          peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_48);
          ::std::__cxx11::string::string((string *)&__range3_1,(string *)local_b8);
          bVar1 = check_name(peVar4,(string *)&__range3_1);
          ::std::__cxx11::string::~string((string *)&__range3_1);
          if (bVar1) {
            return local_b8;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        __end3_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&peVar4->aliases_);
        les_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&peVar4->aliases_);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&les_1), bVar1) {
          local_f8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end3_1);
          ::std::__cxx11::string::string((string *)&cmpres,(string *)local_f8);
          bVar1 = check_name(subcom,(string *)&cmpres);
          ::std::__cxx11::string::~string((string *)&cmpres);
          if (bVar1) {
            return local_f8;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3_1);
        }
        peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        get_name_abi_cxx11_(peVar4);
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
          psVar6 = _compare_subcommand_names_abi_cxx11_(this,subcom,peVar4);
          uVar5 = ::std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            return psVar6;
          }
        }
        get_name_abi_cxx11_(subcom);
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
          psVar6 = _compare_subcommand_names_abi_cxx11_(this,peVar4,subcom);
          uVar5 = ::std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            return psVar6;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end1);
    }
  }
  this_local = (App *)&_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::
                       estring_abi_cxx11_;
  return (string *)this_local;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &App::_compare_subcommand_names(const App &subcom,
                                                                               const App &base) const {
    static const std::string estring;
    if(subcom.disabled_) {
        return estring;
    }
    for(const auto &subc : base.subcommands_) {
        if(subc.get() != &subcom) {
            if(subc->disabled_) {
                continue;
            }
            if(!subcom.get_name().empty()) {
                if(subc->check_name(subcom.get_name())) {
                    return subcom.get_name();
                }
            }
            if(!subc->get_name().empty()) {
                if(subcom.check_name(subc->get_name())) {
                    return subc->get_name();
                }
            }
            for(const auto &les : subcom.aliases_) {
                if(subc->check_name(les)) {
                    return les;
                }
            }
            // this loop is needed in case of ignore_underscore or ignore_case on one but not the other
            for(const auto &les : subc->aliases_) {
                if(subcom.check_name(les)) {
                    return les;
                }
            }
            // if the subcommand is an option group we need to check deeper
            if(subc->get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(subcom, *subc);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
            // if the test subcommand is an option group we need to check deeper
            if(subcom.get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(*subc, subcom);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
        }
    }
    return estring;
}